

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O2

void __thiscall
Impl2T<poly::virtual_cloning_policy>::Impl2T
          (Impl2T<poly::virtual_cloning_policy> *this,Impl2T<poly::virtual_cloning_policy> *o)

{
  double *pdVar1;
  
  Interface::Interface(&this->super_Interface,&o->super_Interface);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_002c1870;
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._storage = (void_pointer)0x0;
  (this->v).super_allocator_base<std::allocator<unsigned_char>_>._end_storage = (void_pointer)0x0;
  (this->v)._free_elem = (elem_ptr_pointer)0x0;
  (this->v)._begin_storage = (void_pointer)0x0;
  (this->v)._align_max = 8;
  pdVar1 = (double *)operator_new__(0x448);
  (this->p)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar1;
  (this->cookie).cookie = 0xdeadbeef;
  return;
}

Assistant:

Impl2T(const Impl2T& o)
        : Interface(o)
        , p { new double[137] }
    {
        cookie.set();
    }